

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::validateBuiltinArgs
          (Interpreter *this,LocationRange *loc,string *name,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args,vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                *params)

{
  Type *pTVar1;
  Type TVar2;
  pointer pTVar3;
  pointer pVVar4;
  Type *pTVar5;
  pointer pVVar6;
  ostream *poVar7;
  RuntimeError *__return_storage_ptr__;
  long lVar8;
  Type t;
  Type t_00;
  pointer pTVar9;
  char *pcVar10;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_208;
  Interpreter *local_1e8;
  LocationRange *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  pVVar6 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(args->
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6 >> 4;
  pTVar9 = (params->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (lVar8 == (long)(params->
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar9 >> 2) {
    lVar11 = 0;
    do {
      if (lVar8 == lVar11) {
        return;
      }
      pTVar5 = &pVVar6->t;
      pVVar6 = pVVar6 + 1;
      pTVar1 = pTVar9 + lVar11;
      lVar11 = lVar11 + 1;
    } while (*pTVar5 == *pTVar1);
  }
  local_1e8 = this;
  local_1e0 = loc;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::operator+(&local_1d8,"Builtin function ",name);
  std::operator+(&bStack_208,&local_1d8," expected (");
  std::operator<<(local_1a8,(string *)&bStack_208);
  std::__cxx11::string::~string((string *)&bStack_208);
  std::__cxx11::string::~string((string *)&local_1d8);
  pTVar3 = (params->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pcVar10 = "";
  for (pTVar9 = (params->
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                )._M_impl.super__Vector_impl_data._M_start; pTVar9 != pTVar3; pTVar9 = pTVar9 + 1) {
    TVar2 = *pTVar9;
    poVar7 = std::operator<<(local_1a8,pcVar10);
    (anonymous_namespace)::type_str_abi_cxx11_(&bStack_208,(_anonymous_namespace_ *)(ulong)TVar2,t);
    std::operator<<(poVar7,(string *)&bStack_208);
    std::__cxx11::string::~string((string *)&bStack_208);
    pcVar10 = ", ";
  }
  std::operator<<(local_1a8,") but got (");
  pVVar4 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pcVar10 = "";
  for (pVVar6 = (args->
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                )._M_impl.super__Vector_impl_data._M_start; pVVar6 != pVVar4; pVVar6 = pVVar6 + 1) {
    TVar2 = pVVar6->t;
    poVar7 = std::operator<<(local_1a8,pcVar10);
    (anonymous_namespace)::type_str_abi_cxx11_
              (&bStack_208,(_anonymous_namespace_ *)(ulong)TVar2,t_00);
    std::operator<<(poVar7,(string *)&bStack_208);
    std::__cxx11::string::~string((string *)&bStack_208);
    pcVar10 = ", ";
  }
  std::operator<<(local_1a8,")");
  __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  Stack::makeError(__return_storage_ptr__,&local_1e8->stack,local_1e0,&bStack_208);
  __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

void validateBuiltinArgs(const LocationRange &loc, const std::string &name,
                             const std::vector<Value> &args, const std::vector<Value::Type> params)
    {
        if (args.size() == params.size()) {
            for (std::size_t i = 0; i < args.size(); ++i) {
                if (args[i].t != params[i])
                    goto bad;
            }
            return;
        }
    bad:;
        std::stringstream ss;
        ss << "Builtin function " + name + " expected (";
        const char *prefix = "";
        for (auto p : params) {
            ss << prefix << type_str(p);
            prefix = ", ";
        }
        ss << ") but got (";
        prefix = "";
        for (auto a : args) {
            ss << prefix << type_str(a);
            prefix = ", ";
        }
        ss << ")";
        throw makeError(loc, ss.str());
    }